

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  uint len;
  bool bVar3;
  stbi_uc **ppsVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  stbi_uc *psVar17;
  stbi__png *psVar18;
  stbi_uc *psVar19;
  byte *pbVar20;
  char *in_RCX;
  stbi_uc *psVar21;
  uint uVar22;
  int iVar23;
  uint y_00;
  uint uVar24;
  stbi_uc *psVar25;
  size_t __n;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  byte bVar30;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  stbi_uc asStack_528 [8];
  stbi_uc palette [1024];
  stbi__uint16 local_10e [3];
  long lStack_108;
  stbi__uint16 tc16 [3];
  ulong local_e0;
  undefined1 local_ac [8];
  stbi__uint32 raw_len;
  stbi__png *local_a0;
  ulong local_98;
  stbi__png *local_90;
  ulong local_88;
  stbi_uc **local_80;
  uint local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  stbi_uc *local_68;
  int local_60;
  stbi_uc local_5c [4];
  stbi_uc tc [3];
  stbi__png *psStack_58;
  stbi__png *local_48;
  int local_34;
  
  local_5c[2] = 0;
  local_5c[0] = '\0';
  local_5c[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  psStack_58 = z;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = 1;
    if (scan != 1) {
      local_80 = &psStack_58->idata;
      psVar1 = s->buffer_start;
      local_68 = s->buffer_start + 1;
      bVar3 = true;
      bVar8 = 0;
      local_98 = 0;
      local_70 = 0;
      local_88 = 0;
      local_48 = (stbi__png *)0x0;
      len = 0;
      local_90 = (stbi__png *)0x0;
      bVar6 = 0;
      local_6c = req_comp;
      local_60 = scan;
      do {
        iVar9 = stbi__get16be(s);
        uVar10 = stbi__get16be(s);
        uVar24 = iVar9 * 0x10000 + uVar10;
        uVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        psVar18 = psStack_58;
        ppsVar4 = local_80;
        uVar22 = uVar11 << 0x10 | uVar12;
        uVar13 = (uint)local_88;
        if ((int)uVar22 < 0x49484452) {
          if (uVar22 == 0x43674249) {
            local_70 = 1;
LAB_0012a2a3:
            stbi__skip(s,uVar24);
          }
          else {
            if (uVar22 != 0x49444154) {
              if (uVar22 != 0x49454e44) {
LAB_0012a2e7:
                if (bVar3) goto LAB_0012a38f;
                bVar3 = false;
                if ((uVar11 >> 0xd & 1) != 0) goto LAB_0012a2a3;
                stbi__parse_png_file::invalid_chunk[0] = (char)(uVar22 >> 0x18);
                in_RCX = (char *)(ulong)(uVar22 >> 0x10);
                stbi__parse_png_file::invalid_chunk[1] = (char)(uVar22 >> 0x10);
                stbi__parse_png_file::invalid_chunk[2] = (char)(uVar12 >> 8);
                stbi__parse_png_file::invalid_chunk[3] = (char)uVar12;
                stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
                bVar3 = false;
                goto LAB_0012a3b1;
              }
              if (bVar3) {
                stbi__g_failure_reason = "first not IHDR";
                goto LAB_0012a1fb;
              }
              if (local_60 == 0) {
                if (*local_80 == (stbi_uc *)0x0) {
                  stbi__g_failure_reason = "no IDAT";
                  local_34 = 0;
                  goto LAB_0012a855;
                }
                local_ac._0_4_ =
                     s->img_n * s->img_y * (psStack_58->depth * s->img_x + 7 >> 3) + s->img_y;
                in_RCX = local_ac;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*local_80,len,local_ac._0_4_,(int *)in_RCX,
                                     (uint)(local_70 == 0));
                uVar24 = local_6c;
                ppsVar4 = local_80;
                psVar18->expanded = psVar17;
                local_34 = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  bVar33 = local_6c == 3;
                  free(*local_80);
                  psVar18 = psStack_58;
                  *ppsVar4 = (stbi_uc *)0x0;
                  uVar10 = s->img_n + 1;
                  if ((char)local_90 == '\0' && ((bVar6 != 0 || bVar33) || uVar10 != uVar24)) {
                    s->img_out_n = s->img_n;
                  }
                  else {
                    s->img_out_n = uVar10;
                  }
                  psVar17 = psStack_58->expanded;
                  uVar24 = s->img_out_n;
                  iVar9 = psStack_58->depth;
                  iVar23 = uVar24 << (iVar9 == 0x10);
                  x = psStack_58->s->img_x;
                  y = psStack_58->s->img_y;
                  if (bVar8 == 0) {
                    in_RCX = (char *)(ulong)uVar24;
                    iVar9 = stbi__create_png_image_raw
                                      (psStack_58,psVar17,local_ac._0_4_,uVar24,x,y,iVar9,
                                       (int)local_98);
                    if (iVar9 == 0) goto LAB_0012a1fb;
                  }
                  else {
                    local_ac._4_4_ = local_ac._0_4_;
                    psVar19 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar23,0);
                    local_a0 = (stbi__png *)(long)iVar23;
                    lVar26 = 0;
                    do {
                      psVar2 = psVar18->s;
                      uVar10 = (&DAT_0014a220)[lVar26];
                      uVar11 = (&DAT_0014a260)[lVar26];
                      uVar27 = ~uVar10 + psVar2->img_x + uVar11;
                      local_78 = uVar27 / uVar11;
                      uVar12 = (&DAT_0014a240)[lVar26];
                      uVar13 = (&DAT_0014a280)[lVar26];
                      uVar22 = ~uVar12 + psVar2->img_y + uVar13;
                      in_RCX = (char *)(ulong)uVar22;
                      y_00 = uVar22 / uVar13;
                      bVar33 = true;
                      if ((uVar11 <= uVar27) && (uVar13 <= uVar22)) {
                        iVar14 = local_78 * iVar9;
                        iVar23 = psVar2->img_n;
                        in_RCX = (char *)(ulong)uVar24;
                        lStack_108 = lVar26;
                        local_74 = uVar13;
                        iVar15 = stbi__create_png_image_raw
                                           (psVar18,psVar17,local_ac._4_4_,uVar24,local_78,y_00,
                                            iVar9,(int)local_98);
                        if (iVar15 == 0) {
                          free(psVar19);
                          bVar33 = false;
                          lVar26 = lStack_108;
                        }
                        else {
                          in_RCX = (char *)local_a0;
                          raw_len = y_00;
                          if (0 < (int)y_00) {
                            lVar26 = (long)(int)local_78;
                            iVar15 = uVar12 * (int)local_a0;
                            local_74 = local_74 * (int)local_a0;
                            lVar32 = (long)(int)uVar10 * (long)local_a0;
                            lVar28 = (long)(int)uVar11 * (long)local_a0;
                            local_e0 = 0;
                            do {
                              if (0 < (int)local_78) {
                                psVar2 = psStack_58->s;
                                psVar21 = psStack_58->out;
                                palette._1016_8_ = local_e0 * lVar26;
                                lVar29 = 0;
                                psVar25 = psVar19 + lVar32;
                                do {
                                  memcpy(psVar25 + psVar2->img_x * iVar15,
                                         psVar21 + (palette._1016_8_ + lVar29) * (long)in_RCX,
                                         (size_t)local_a0);
                                  lVar29 = lVar29 + 1;
                                  psVar25 = psVar25 + lVar28;
                                  in_RCX = (char *)local_a0;
                                } while (lVar29 < lVar26);
                              }
                              local_e0 = local_e0 + 1;
                              iVar15 = iVar15 + local_74;
                            } while (local_e0 < y_00);
                          }
                          psVar18 = psStack_58;
                          uVar10 = ((iVar14 * iVar23 + 7 >> 3) + 1) * raw_len;
                          free(psStack_58->out);
                          psVar17 = psVar17 + uVar10;
                          local_ac._4_4_ = local_ac._4_4_ - uVar10;
                          bVar33 = true;
                          lVar26 = lStack_108;
                        }
                      }
                      if (!bVar33) goto LAB_0012a1fb;
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                    psVar18->out = psVar19;
                  }
                  uVar24 = local_6c;
                  if ((char)local_90 != '\0') {
                    if (psStack_58->depth == 0x10) {
                      stbi__compute_transparency16(psStack_58,local_10e,s->img_out_n);
                    }
                    else {
                      stbi__compute_transparency(psStack_58,local_5c,s->img_out_n);
                    }
                  }
                  if (((local_70 != 0) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                    stbi__de_iphone(psStack_58);
                  }
                  if (bVar6 == 0) {
                    if ((char)local_90 != '\0') {
                      s->img_n = s->img_n + 1;
                    }
                  }
                  else {
                    s->img_n = (uint)bVar6;
                    uVar10 = (uint)bVar6;
                    if (2 < (int)uVar24) {
                      uVar10 = uVar24;
                    }
                    s->img_out_n = uVar10;
                    psVar17 = psStack_58->out;
                    uVar24 = psStack_58->s->img_y * psStack_58->s->img_x;
                    in_RCX = (char *)psStack_58;
                    psVar19 = (stbi_uc *)stbi__malloc_mad2(uVar24,uVar10,0);
                    if (psVar19 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "outofmem";
                    }
                    else {
                      if (uVar10 == 3) {
                        if (uVar24 != 0) {
                          in_RCX = (char *)0x0;
                          psVar21 = psVar19;
                          do {
                            uVar16 = (ulong)psVar17[(long)in_RCX];
                            *psVar21 = asStack_528[uVar16 * 4];
                            psVar21[1] = asStack_528[uVar16 * 4 + 1];
                            psVar21[2] = asStack_528[uVar16 * 4 + 2];
                            psVar21 = psVar21 + 3;
                            in_RCX = (char *)((long)&((stbi__png *)in_RCX)->s + 1);
                          } while ((stbi__png *)(ulong)uVar24 != (stbi__png *)in_RCX);
                        }
                      }
                      else if (uVar24 != 0) {
                        in_RCX = (char *)0x0;
                        do {
                          uVar16 = (ulong)psVar17[(long)in_RCX];
                          psVar19[(long)in_RCX * 4] = asStack_528[uVar16 * 4];
                          psVar19[(long)in_RCX * 4 + 1] = asStack_528[uVar16 * 4 + 1];
                          psVar19[(long)in_RCX * 4 + 2] = asStack_528[uVar16 * 4 + 2];
                          psVar19[(long)in_RCX * 4 + 3] = asStack_528[uVar16 * 4 + 3];
                          in_RCX = (char *)((long)&((stbi__png *)in_RCX)->s + 1);
                        } while ((stbi__png *)(ulong)uVar24 != (stbi__png *)in_RCX);
                      }
                      free(psVar17);
                      psStack_58->out = psVar19;
                    }
                    if (psVar19 == (stbi_uc *)0x0) goto LAB_0012a855;
                  }
                  psVar18 = psStack_58;
                  free(psStack_58->expanded);
                  psVar18->expanded = (stbi_uc *)0x0;
                  goto LAB_0012a3cc;
                }
LAB_0012a1fb:
                local_34 = 0;
              }
              else {
LAB_0012a3cc:
                local_34 = 1;
              }
LAB_0012a855:
              bVar33 = false;
              goto LAB_0012a857;
            }
            if (bVar3) goto LAB_0012a38f;
            if ((bVar6 != 0) && (uVar13 == 0)) {
              stbi__g_failure_reason = "no PLTE";
LAB_0012a365:
              local_88 = 0;
LAB_0012a649:
              bVar3 = false;
              bVar33 = false;
              local_34 = 0;
              goto LAB_0012a857;
            }
            if (local_60 == 2) {
              s->img_n = (uint)bVar6;
LAB_0012a687:
              local_34 = 1;
LAB_0012a68e:
              bVar3 = false;
              goto LAB_0012a855;
            }
            uVar10 = uVar24 + len;
            if ((int)uVar10 < (int)len) goto LAB_0012a649;
            if ((uint)local_48 < uVar10) {
              psVar18 = (stbi__png *)0x1000;
              if (0x1000 < uVar24) {
                psVar18 = (stbi__png *)(ulong)uVar24;
              }
              if ((uint)local_48 != 0) {
                psVar18 = local_48;
              }
              do {
                local_48 = psVar18;
                psVar18 = (stbi__png *)(ulong)((uint)local_48 * 2);
              } while ((uint)local_48 < uVar10);
              in_RCX = (char *)local_48;
              psVar17 = (stbi_uc *)realloc(*local_80,(size_t)local_48);
              if (psVar17 == (stbi_uc *)0x0) {
                in_RCX = "outofmem";
                stbi__g_failure_reason = "outofmem";
                local_34 = 0;
                goto LAB_0012a68e;
              }
              *ppsVar4 = psVar17;
            }
            psVar17 = *local_80 + len;
            if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012af6a:
              __n = (size_t)(int)uVar24;
              in_RCX = (char *)0x0;
              if (s->img_buffer + __n <= s->img_buffer_end) {
                memcpy(psVar17,s->img_buffer,__n);
                s->img_buffer = s->img_buffer + __n;
                in_RCX = (char *)0x1;
              }
            }
            else {
              iVar23 = (int)s->img_buffer_end - (int)s->img_buffer;
              iVar9 = uVar24 - iVar23;
              if (iVar9 != 0 && iVar23 <= (int)uVar24) {
                local_a0 = (stbi__png *)(long)iVar23;
                memcpy(psVar17,s->img_buffer,(size_t)local_a0);
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)(psVar17 + (long)&local_a0->s),
                                         iVar9);
                in_RCX = (char *)(ulong)(iVar14 == iVar9);
                s->img_buffer = s->img_buffer_end;
              }
              if ((int)uVar24 <= iVar23) goto LAB_0012af6a;
            }
            if ((int)in_RCX == 0) {
              stbi__g_failure_reason = "outofdata";
              bVar3 = false;
              goto LAB_0012a3b1;
            }
            bVar3 = false;
            len = uVar10;
          }
LAB_0012a61b:
          stbi__get16be(s);
          stbi__get16be(s);
          bVar33 = true;
        }
        else {
          if (uVar22 == 0x74524e53) {
            if (!bVar3) {
              if (*local_80 == (stbi_uc *)0x0) {
                if (bVar6 == 0) {
                  if ((s->img_n & 1U) == 0) {
                    stbi__g_failure_reason = "tRNS with alpha";
                  }
                  else {
                    if (s->img_n * 2 == uVar24) {
                      in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
                      local_90 = (stbi__png *)in_RCX;
                      if (psStack_58->depth == 0x10) {
                        if (s->img_n < 1) {
LAB_0012b1b0:
                          bVar3 = false;
                          bVar6 = 0;
                          goto LAB_0012a61b;
                        }
                        lVar26 = 0;
                        do {
                          iVar9 = stbi__get16be(s);
                          local_10e[lVar26] = (stbi__uint16)iVar9;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 < s->img_n);
                      }
                      else {
                        if (s->img_n < 1) goto LAB_0012b1b0;
                        lVar26 = 0;
                        do {
                          uVar24 = stbi__get16be(s);
                          in_RCX = (char *)(ulong)uVar24;
                          local_5c[lVar26] = ""[psVar18->depth] * (char)uVar24;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 < s->img_n);
                      }
                      bVar3 = false;
                      bVar6 = 0;
                      goto LAB_0012a61b;
                    }
                    stbi__g_failure_reason = "bad tRNS len";
                  }
                  bVar6 = 0;
                }
                else {
                  if (local_60 == 2) {
                    s->img_n = 4;
                    goto LAB_0012a687;
                  }
                  if (uVar13 == 0) {
                    stbi__g_failure_reason = "tRNS before PLTE";
                    goto LAB_0012a365;
                  }
                  if (uVar24 <= uVar13) {
                    bVar6 = 4;
                    bVar3 = false;
                    if (uVar24 != 0) {
                      uVar16 = 0;
                      do {
                        psVar17 = s->img_buffer;
                        if (psVar17 < s->img_buffer_end) {
LAB_0012aced:
                          in_RCX = (char *)(psVar17 + 1);
                          s->img_buffer = (stbi_uc *)in_RCX;
                          sVar7 = *psVar17;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar23 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar23 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = local_68;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar23;
                            }
                            psVar17 = s->img_buffer;
                            goto LAB_0012aced;
                          }
                          sVar7 = '\0';
                        }
                        asStack_528[uVar16 * 4 + 3] = sVar7;
                        uVar16 = uVar16 + 1;
                      } while (uVar10 + iVar9 * 0x10000 != uVar16);
                    }
                    goto LAB_0012a61b;
                  }
                  stbi__g_failure_reason = "bad tRNS len";
                }
              }
              else {
                stbi__g_failure_reason = "tRNS after IDAT";
              }
              goto LAB_0012a649;
            }
          }
          else {
            if (uVar22 != 0x504c5445) {
              if (uVar22 != 0x49484452) goto LAB_0012a2e7;
              if (bVar3) {
                if (uVar24 != 0xd) {
                  stbi__g_failure_reason = "bad IHDR len";
                  goto LAB_0012a5fc;
                }
                iVar9 = stbi__get16be(s);
                uVar24 = stbi__get16be(s);
                uVar24 = uVar24 | iVar9 << 0x10;
                s->img_x = uVar24;
                if (0x1000000 < uVar24) {
LAB_0012a290:
                  stbi__g_failure_reason = "too large";
                  goto LAB_0012a5fc;
                }
                iVar9 = stbi__get16be(s);
                uVar24 = stbi__get16be(s);
                psVar18 = psStack_58;
                uVar24 = uVar24 | iVar9 << 0x10;
                s->img_y = uVar24;
                if (0x1000000 < uVar24) goto LAB_0012a290;
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_0012ae3c:
                  s->img_buffer = pbVar20 + 1;
                  bVar30 = *pbVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar9 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_68;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar9;
                    }
                    pbVar20 = s->img_buffer;
                    goto LAB_0012ae3c;
                  }
                  bVar30 = 0;
                }
                psVar18->depth = (uint)bVar30;
                if ((0x10 < bVar30) || ((0x10116U >> (bVar30 & 0x1f) & 1) == 0)) {
                  stbi__g_failure_reason = "1/2/4/8/16-bit only";
                  goto LAB_0012a5fc;
                }
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_0012b005:
                  s->img_buffer = pbVar20 + 1;
                  local_98 = (ulong)*pbVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar9 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_68;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar9;
                    }
                    pbVar20 = s->img_buffer;
                    goto LAB_0012b005;
                  }
                  local_98 = 0;
                }
                bVar30 = (byte)local_98;
                if (bVar30 < 7) {
                  if ((int)local_98 == 3) {
                    bVar5 = 3;
                    if (psStack_58->depth == 0x10) {
                      stbi__g_failure_reason = "bad ctype";
                      local_98 = 3;
                      goto LAB_0012a5fc;
                    }
                  }
                  else {
                    bVar5 = bVar6;
                    if ((local_98 & 1) != 0) goto LAB_0012b023;
                  }
                  bVar6 = bVar5;
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_0012b1ee:
                    s->img_buffer = psVar17 + 1;
                    if (*psVar17 != '\0') {
                      stbi__g_failure_reason = "bad comp method";
                      goto LAB_0012a5fc;
                    }
                  }
                  else if (s->read_from_callbacks != 0) {
                    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar9 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_68;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar9;
                    }
                    psVar17 = s->img_buffer;
                    goto LAB_0012b1ee;
                  }
                  sVar7 = stbi__get8(s);
                  if (sVar7 == '\0') {
                    bVar8 = stbi__get8(s);
                    if (bVar8 < 2) {
                      uVar24 = s->img_x;
                      if ((uVar24 != 0) && (uVar10 = s->img_y, uVar10 != 0)) {
                        if (bVar6 == 0) {
                          uVar11 = (uint)(3 < bVar30) + ((uint)local_98 & 2) + 1;
                          s->img_n = uVar11;
                          if ((uint)((0x40000000 / (ulong)uVar24) / (ulong)uVar11) < uVar10) {
                            stbi__g_failure_reason = "too large";
                            bVar6 = 0;
                            goto LAB_0012a5fc;
                          }
                          if (local_60 == 2) {
                            local_34 = 1;
                            in_RCX = (char *)0x0;
                            bVar6 = 0;
                            goto LAB_0012a607;
                          }
                        }
                        else {
                          s->img_n = 1;
                          if ((uint)(0x40000000 / (ulong)uVar24 >> 2) < uVar10) {
                            stbi__g_failure_reason = "too large";
                            goto LAB_0012a5fc;
                          }
                        }
                        in_RCX = (char *)CONCAT71((uint7)(uint3)(uVar10 >> 8),1);
                        goto LAB_0012a607;
                      }
                      stbi__g_failure_reason = "0-pixel image";
                    }
                    else {
                      stbi__g_failure_reason = "bad interlace method";
                    }
                  }
                  else {
                    stbi__g_failure_reason = "bad filter method";
                  }
                  goto LAB_0012a5fc;
                }
LAB_0012b023:
                stbi__g_failure_reason = "bad ctype";
                in_RCX = (char *)0x0;
                local_34 = 0;
              }
              else {
                stbi__g_failure_reason = "multiple IHDR";
LAB_0012a5fc:
                in_RCX = (char *)0x0;
                local_34 = 0;
              }
LAB_0012a607:
              bVar3 = false;
              bVar33 = false;
              if ((char)in_RCX == '\0') goto LAB_0012a857;
              goto LAB_0012a61b;
            }
            if (!bVar3) {
              if ((0x300 < uVar24) ||
                 (uVar16 = (ulong)uVar10 * 0x55555556 >> 0x20, local_88 = uVar16,
                 (int)((ulong)uVar10 * 0x55555556 >> 0x20) * 3 != uVar24)) {
                stbi__g_failure_reason = "invalid PLTE";
                goto LAB_0012a649;
              }
              bVar3 = false;
              if (2 < uVar10) {
                uVar31 = 0;
                do {
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_0012a4a4:
                    in_RCX = (char *)(psVar17 + 1);
                    s->img_buffer = (stbi_uc *)in_RCX;
                    sVar7 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar9 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = local_68;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar9;
                      }
                      psVar17 = s->img_buffer;
                      goto LAB_0012a4a4;
                    }
                    sVar7 = '\0';
                  }
                  asStack_528[uVar31 * 4] = sVar7;
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_0012a530:
                    in_RCX = (char *)(psVar17 + 1);
                    s->img_buffer = (stbi_uc *)in_RCX;
                    sVar7 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar9 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = local_68;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar9;
                      }
                      psVar17 = s->img_buffer;
                      goto LAB_0012a530;
                    }
                    sVar7 = '\0';
                  }
                  asStack_528[uVar31 * 4 + 1] = sVar7;
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_0012a5bc:
                    in_RCX = (char *)(psVar17 + 1);
                    s->img_buffer = (stbi_uc *)in_RCX;
                    sVar7 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar9 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = local_68;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar9;
                      }
                      psVar17 = s->img_buffer;
                      goto LAB_0012a5bc;
                    }
                    sVar7 = '\0';
                  }
                  asStack_528[uVar31 * 4 + 2] = sVar7;
                  asStack_528[uVar31 * 4 + 3] = 0xff;
                  uVar31 = uVar31 + 1;
                } while (uVar16 != uVar31);
              }
              goto LAB_0012a61b;
            }
          }
LAB_0012a38f:
          stbi__g_failure_reason = "first not IHDR";
          bVar3 = true;
LAB_0012a3b1:
          local_34 = 0;
          bVar33 = false;
        }
LAB_0012a857:
      } while (bVar33);
    }
  }
  return local_34;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}